

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Foo>::PromiseResolver
          (PromiseResolver<(anonymous_namespace)::Foo> *this,
          QPromise<(anonymous_namespace)::Foo> *promise)

{
  Data *pDVar1;
  QPromise<(anonymous_namespace)::Foo> *this_00;
  QPromise<(anonymous_namespace)::Foo> *promise_local;
  PromiseResolver<(anonymous_namespace)::Foo> *this_local;
  
  pDVar1 = (Data *)operator_new(0x10);
  QSharedData::QSharedData((QSharedData *)pDVar1);
  pDVar1->promise = (QPromise<(anonymous_namespace)::Foo> *)0x0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Foo>::Data>
  ::QExplicitlySharedDataPointer(&this->m_d,pDVar1);
  this_00 = (QPromise<(anonymous_namespace)::Foo> *)operator_new(0x10);
  QtPromise::QPromise<(anonymous_namespace)::Foo>::QPromise(this_00,promise);
  pDVar1 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Foo>::Data>
           ::operator->(&this->m_d);
  pDVar1->promise = this_00;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }